

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCacheClear(Parse *pParse)

{
  yColCache *local_20;
  yColCache *p;
  int i;
  Parse *pParse_local;
  
  local_20 = pParse->aColCache;
  for (p._4_4_ = 0; p._4_4_ < 10; p._4_4_ = p._4_4_ + 1) {
    if (local_20->iReg != 0) {
      cacheEntryClear(pParse,local_20);
      local_20->iReg = 0;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheClear(Parse *pParse){
  int i;
  struct yColCache *p;

  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    if( p->iReg ){
      cacheEntryClear(pParse, p);
      p->iReg = 0;
    }
  }
}